

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall YAML::Parser::HandleTagDirective(Parser *this,Token *token)

{
  bool bVar1;
  size_type sVar2;
  undefined8 uVar3;
  Mark *mark_;
  ParserException *this_00;
  mapped_type *this_01;
  long in_RSI;
  key_type *in_RDI;
  string *prefix;
  string *handle;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  const_reference pvVar4;
  Mark *in_stack_ffffffffffffff38;
  ParserException *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff76;
  allocator in_stack_ffffffffffffff77;
  string local_88 [32];
  _Self local_68;
  _Self local_60;
  const_reference local_58;
  const_reference local_50;
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RSI + 0x38));
  if (sVar2 != 2) {
    local_45 = 1;
    uVar3 = __cxa_allocate_exception(0x40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"TAG directives must have exactly two arguments",&local_31);
    ParserException::ParserException
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    local_45 = 0;
    __cxa_throw(uVar3,&ParserException::typeinfo,ParserException::~ParserException);
  }
  local_50 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_10 + 0x38),0);
  local_58 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(local_10 + 0x38),1);
  std::unique_ptr<YAML::Directives,_std::default_delete<YAML::Directives>_>::operator->
            ((unique_ptr<YAML::Directives,_std::default_delete<YAML::Directives>_> *)0xf13c2a);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0xf13c3e);
  std::unique_ptr<YAML::Directives,_std::default_delete<YAML::Directives>_>::operator->
            ((unique_ptr<YAML::Directives,_std::default_delete<YAML::Directives>_> *)0xf13c51);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::operator!=(&local_60,&local_68);
  if (!bVar1) {
    pvVar4 = local_58;
    std::unique_ptr<YAML::Directives,_std::default_delete<YAML::Directives>_>::operator->
              ((unique_ptr<YAML::Directives,_std::default_delete<YAML::Directives>_> *)0xf13d6c);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff77,
                                       CONCAT16(in_stack_ffffffffffffff76,in_stack_ffffffffffffff70)
                                      ),in_RDI);
    std::__cxx11::string::operator=((string *)this_01,(string *)pvVar4);
    return;
  }
  mark_ = (Mark *)__cxa_allocate_exception(0x40);
  this_00 = (ParserException *)(local_10 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,"repeated TAG directive",(allocator *)&stack0xffffffffffffff77);
  ParserException::ParserException(this_00,mark_,in_stack_ffffffffffffff30);
  __cxa_throw(mark_,&ParserException::typeinfo,ParserException::~ParserException);
}

Assistant:

void Parser::HandleTagDirective(const Token& token) {
  if (token.params.size() != 2)
    throw ParserException(token.mark, ErrorMsg::TAG_DIRECTIVE_ARGS);

  const std::string& handle = token.params[0];
  const std::string& prefix = token.params[1];
  if (m_pDirectives->tags.find(handle) != m_pDirectives->tags.end()) {
    throw ParserException(token.mark, ErrorMsg::REPEATED_TAG_DIRECTIVE);
  }

  m_pDirectives->tags[handle] = prefix;
}